

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_is_input_port(asmcode *code,compiler_options *param_2)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  operation local_a4 [2];
  operand local_9c [2];
  operation local_94 [4];
  operand local_84 [2];
  operation local_7c;
  unsigned_long local_78;
  operand local_70 [2];
  operation local_68 [4];
  undefined1 local_58 [8];
  string done;
  string lab_false;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  jump_short_if_arg_is_not_block(code,RAX,RBX,(string *)((long)&done.field_2 + 8));
  local_68[0] = AND;
  local_70[1] = 9;
  local_70[0] = NUMBER;
  local_78 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_68,local_70 + 1,local_70,&local_78);
  jump_short_if_arg_does_not_point_to_port(code,RAX,RBX,(string *)((long)&done.field_2 + 8));
  local_7c = MOV;
  local_84[1] = 9;
  local_84[0] = MEM_RAX;
  local_94[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_7c,local_84 + 1,local_84,(int *)(local_94 + 3));
  local_94[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_94 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_94[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_94 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_94[0] = MOV;
  local_9c[1] = 9;
  local_9c[0] = NUMBER;
  local_a4[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_94,local_9c + 1,local_9c,(int *)(local_a4 + 1));
  local_a4[0] = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_a4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  return;
}

Assistant:

void inline_is_input_port(ASM::asmcode& code, const compiler_options&)
  {
  auto lab_false = label_to_string(label++);
  auto done = label_to_string(label++);
  jump_short_if_arg_is_not_block(code, ASM::asmcode::RAX, ASM::asmcode::RBX, lab_false);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  jump_short_if_arg_does_not_point_to_port(code, ASM::asmcode::RAX, ASM::asmcode::RBX, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::JMPS, done);
  code.add(ASM::asmcode::LABEL, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  code.add(ASM::asmcode::LABEL, done);
  }